

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

void __thiscall
RandomWordTestData<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::RandomWordTestData
          (RandomWordTestData<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_delim,
          size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  size_t in_fixed_word_length_local;
  size_t in_fixed_word_count_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_delim_local;
  RandomWordTestData<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::__cxx11::string::string((string *)this,in_delim);
  this->m_fixed_word_count = in_fixed_word_count;
  this->m_fixed_word_length = in_fixed_word_length;
  std::__cxx11::string::string((string *)&this->m_str);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_tokens);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_token_indexes);
  populate(this);
  return;
}

Assistant:

RandomWordTestData(StringT in_delim, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
	: m_delim{ in_delim },
	m_fixed_word_count{ in_fixed_word_count },
	m_fixed_word_length{ in_fixed_word_length } {
		populate();
	}